

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_from_matrix(rf_mat mat)

{
  double dVar1;
  rf_mat mat_00;
  rf_quaternion rVar2;
  rf_mat rVar3;
  float fVar4;
  float in_stack_00000008;
  float in_stack_0000000c;
  undefined8 in_stack_ffffffffffffffa8;
  float invS_3;
  float s_3;
  float invS_2;
  float s_2;
  float invS_1;
  float s_1;
  float m22;
  float m11;
  float m00;
  float invS;
  float s;
  float trace;
  rf_quaternion result;
  
  rVar3 = mat;
  memset(&s,0,0x10);
  mat_00.m11 = (float)(int)in_stack_ffffffffffffffa8;
  mat_00.m15 = (float)(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  mat_00.m0 = mat.m0;
  mat_00.m4 = mat.m4;
  mat_00.m8 = mat.m8;
  mat_00.m12 = mat.m12;
  mat_00.m1 = mat.m1;
  mat_00.m5 = mat.m5;
  mat_00.m9 = mat.m9;
  mat_00.m13 = mat.m13;
  mat_00.m2 = mat.m2;
  mat_00.m6 = mat.m6;
  mat_00.m10 = mat.m10;
  mat_00.m14 = mat.m14;
  mat_00.m3 = mat.m3;
  mat_00.m7 = mat.m7;
  fVar4 = rf_mat_trace(mat_00);
  mat.m0 = rVar3.m0;
  mat.m8 = rVar3.m8;
  mat.m1 = rVar3.m1;
  mat.m9 = rVar3.m9;
  mat.m13 = rVar3.m13;
  if (fVar4 <= 0.0) {
    mat.m12 = rVar3.m12;
    mat.m2 = rVar3.m2;
    if ((in_stack_00000008 <= mat.m12) || (in_stack_00000008 <= mat.m2)) {
      if (mat.m12 <= mat.m2) {
        dVar1 = sqrt((double)(((mat.m2 + 1.0) - in_stack_00000008) - mat.m12));
        fVar4 = 1.0 / ((float)dVar1 * 2.0);
        result.y = (mat.m8 - in_stack_0000000c) * fVar4;
        s = (mat.m0 + mat.m9) * fVar4;
        trace = (mat.m1 + mat.m13) * fVar4;
        result.x = (float)dVar1 * 2.0 * 0.25;
      }
      else {
        dVar1 = sqrt((double)(((mat.m12 + 1.0) - in_stack_00000008) - mat.m2));
        fVar4 = 1.0 / ((float)dVar1 * 2.0);
        result.y = (mat.m0 - mat.m9) * fVar4;
        s = (in_stack_0000000c + mat.m8) * fVar4;
        trace = (float)dVar1 * 2.0 * 0.25;
        result.x = (mat.m1 + mat.m13) * fVar4;
      }
    }
    else {
      dVar1 = sqrt((double)(((in_stack_00000008 + 1.0) - mat.m12) - mat.m2));
      fVar4 = 1.0 / ((float)dVar1 * 2.0);
      result.y = (mat.m13 - mat.m1) * fVar4;
      s = (float)dVar1 * 2.0 * 0.25;
      trace = (in_stack_0000000c + mat.m8) * fVar4;
      result.x = (mat.m0 + mat.m9) * fVar4;
    }
  }
  else {
    dVar1 = sqrt((double)(fVar4 + 1.0));
    fVar4 = 1.0 / ((float)dVar1 * 2.0);
    result.y = (float)dVar1 * 2.0 * 0.25;
    s = (mat.m13 - mat.m1) * fVar4;
    trace = (mat.m0 - mat.m9) * fVar4;
    result.x = (mat.m8 - in_stack_0000000c) * fVar4;
  }
  rVar2.y = trace;
  rVar2.x = s;
  rVar2.z = result.x;
  rVar2.w = result.y;
  return rVar2;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_matrix(rf_mat mat)
{
    rf_quaternion result = {0};

    float trace = rf_mat_trace(mat);

    if (trace > 0.0f)
    {
        float s = (float) sqrt(trace + 1) * 2.0f;
        float invS = 1.0f / s;

        result.w = s * 0.25f;
        result.x = (mat.m6 - mat.m9) * invS;
        result.y = (mat.m8 - mat.m2) * invS;
        result.z = (mat.m1 - mat.m4) * invS;
    } else
    {
        float m00 = mat.m0, m11 = mat.m5, m22 = mat.m10;

        if (m00 > m11 && m00 > m22)
        {
            float s = (float) sqrt(1.0f + m00 - m11 - m22) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m6 - mat.m9) * invS;
            result.x = s * 0.25f;
            result.y = (mat.m4 + mat.m1) * invS;
            result.z = (mat.m8 + mat.m2) * invS;
        } else if (m11 > m22)
        {
            float s = (float) sqrt(1.0f + m11 - m00 - m22) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m8 - mat.m2) * invS;
            result.x = (mat.m4 + mat.m1) * invS;
            result.y = s * 0.25f;
            result.z = (mat.m9 + mat.m6) * invS;
        } else
        {
            float s = (float) sqrt(1.0f + m22 - m00 - m11) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m1 - mat.m4) * invS;
            result.x = (mat.m8 + mat.m2) * invS;
            result.y = (mat.m9 + mat.m6) * invS;
            result.z = s * 0.25f;
        }
    }

    return result;
}